

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softfloat.c
# Opt level: O0

float64 roundAndPackFloat64(flag zSign,int zExp,uint64_t zSig,float_status *status)

{
  char cVar1;
  float64 fVar2;
  bool bVar3;
  bool local_41;
  uint local_34;
  _Bool overflow_to_inf;
  int iStack_30;
  flag isTiny;
  int roundBits;
  int roundIncrement;
  flag roundNearestEven;
  int8_t roundingMode;
  float_status *status_local;
  uint64_t zSig_local;
  int zExp_local;
  flag zSign_local;
  
  cVar1 = status->float_rounding_mode;
  status_local = (float_status *)zSig;
  zSig_local._0_4_ = zExp;
  zSig_local._7_1_ = zSign;
  switch(cVar1) {
  case '\0':
  case '\x04':
    iStack_30 = 0x200;
    break;
  case '\x01':
    iStack_30 = 0;
    if (zSign != '\0') {
      iStack_30 = 0x3ff;
    }
    break;
  case '\x02':
    iStack_30 = 0x3ff;
    if (zSign != '\0') {
      iStack_30 = 0;
    }
    break;
  case '\x03':
    iStack_30 = 0;
    break;
  case '\x05':
    iStack_30 = 0x3ff;
    if ((zSig & 0x400) != 0) {
      iStack_30 = 0;
    }
    break;
  default:
    abort();
  }
  local_34 = (uint)zSig & 0x3ff;
  if (0x7fc < (zExp & 0xffffU)) {
    if ((0x7fd < zExp) || ((zExp == 0x7fd && ((long)(zSig + (long)iStack_30) < 0)))) {
      local_41 = cVar1 != '\x05' && iStack_30 != 0;
      float_raise_tricore('(',status);
      fVar2 = packFloat64(zSig_local._7_1_,0x7ff,(long)(int)-((local_41 ^ 0xff) & 1));
      return fVar2;
    }
    if (zExp < 0) {
      if (status->flush_to_zero != '\0') {
        float_raise_tricore(0x80,status);
        fVar2 = packFloat64(zSig_local._7_1_,0,0);
        return fVar2;
      }
      bVar3 = true;
      if ((status->float_detect_tininess != '\x01') && (bVar3 = true, -2 < zExp)) {
        bVar3 = zSig + (long)iStack_30 < 0x8000000000000000;
      }
      shift64RightJamming(zSig,-zExp,(uint64_t *)&status_local);
      zSig_local._0_4_ = 0;
      local_34 = (uint)status_local & 0x3ff;
      if ((bVar3) && (((ulong)status_local & 0x3ff) != 0)) {
        float_raise_tricore('\x10',status);
      }
      if ((cVar1 == '\x05') && (iStack_30 = 0x3ff, ((ulong)status_local & 0x400) != 0)) {
        iStack_30 = 0;
      }
    }
  }
  if (local_34 != 0) {
    status->float_exception_flags = status->float_exception_flags | 0x20;
  }
  status_local = (float_status *)
                 ((long)(int)((local_34 == 0x200 && cVar1 == '\0') ^ 0xffffffff) &
                 (ulong)(&status_local->float_detect_tininess + iStack_30) >> 10);
  if (status_local == (float_status *)0x0) {
    zSig_local._0_4_ = 0;
  }
  fVar2 = packFloat64(zSig_local._7_1_,(int)zSig_local,(uint64_t)status_local);
  return fVar2;
}

Assistant:

static float64 roundAndPackFloat64(flag zSign, int zExp, uint64_t zSig,
                                   float_status *status)
{
    int8_t roundingMode;
    flag roundNearestEven;
    int roundIncrement, roundBits;
    flag isTiny;

    roundingMode = status->float_rounding_mode;
    roundNearestEven = ( roundingMode == float_round_nearest_even );
    switch (roundingMode) {
    case float_round_nearest_even:
    case float_round_ties_away:
        roundIncrement = 0x200;
        break;
    case float_round_to_zero:
        roundIncrement = 0;
        break;
    case float_round_up:
        roundIncrement = zSign ? 0 : 0x3ff;
        break;
    case float_round_down:
        roundIncrement = zSign ? 0x3ff : 0;
        break;
    case float_round_to_odd:
        roundIncrement = (zSig & 0x400) ? 0 : 0x3ff;
        break;
    default:
        abort();
    }
    roundBits = zSig & 0x3FF;
    if ( 0x7FD <= (uint16_t) zExp ) {
        if (    ( 0x7FD < zExp )
             || (    ( zExp == 0x7FD )
                  && ( (int64_t) ( zSig + roundIncrement ) < 0 ) )
           ) {
            bool overflow_to_inf = roundingMode != float_round_to_odd &&
                                   roundIncrement != 0;
            float_raise(float_flag_overflow | float_flag_inexact, status);
            return packFloat64(zSign, 0x7FF, -(!overflow_to_inf));
        }
        if ( zExp < 0 ) {
            if (status->flush_to_zero) {
                float_raise(float_flag_output_denormal, status);
                return packFloat64(zSign, 0, 0);
            }
            isTiny =
                   (status->float_detect_tininess
                    == float_tininess_before_rounding)
                || ( zExp < -1 )
                || ( zSig + roundIncrement < UINT64_C(0x8000000000000000) );
            shift64RightJamming( zSig, - zExp, &zSig );
            zExp = 0;
            roundBits = zSig & 0x3FF;
            if (isTiny && roundBits) {
                float_raise(float_flag_underflow, status);
            }
            if (roundingMode == float_round_to_odd) {
                /*
                 * For round-to-odd case, the roundIncrement depends on
                 * zSig which just changed.
                 */
                roundIncrement = (zSig & 0x400) ? 0 : 0x3ff;
            }
        }
    }
    if (roundBits) {
        status->float_exception_flags |= float_flag_inexact;
    }
    zSig = ( zSig + roundIncrement )>>10;
    zSig &= ~ ( ( ( roundBits ^ 0x200 ) == 0 ) & roundNearestEven );
    if ( zSig == 0 ) zExp = 0;
    return packFloat64( zSign, zExp, zSig );

}